

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

void DrawTexturePro(Texture2D texture,Rectangle source,Rectangle dest,Vector2 origin,float rotation,
                   Color tint)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined8 local_c8;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  
  fVar11 = origin.x;
  fVar14 = origin.y;
  fVar5 = source.width;
  fVar7 = source.height;
  fVar6 = source.x;
  fVar18 = source.y;
  if (texture.id == 0) {
    return;
  }
  fVar17 = fVar5;
  if (fVar5 < 0.0) {
    in_XMM1_Dc = -in_XMM1_Dc;
    in_XMM1_Dd = -in_XMM1_Dd;
    fVar17 = -fVar5;
  }
  if (fVar7 < 0.0) {
    fVar18 = fVar18 - fVar7;
  }
  fVar12 = (float)texture.width;
  fVar4 = (float)texture.height;
  fStack_b4 = dest.x;
  fStack_b0 = dest.y;
  if ((rotation != 0.0) || (NAN(rotation))) {
    fVar2 = sinf(rotation * 0.017453292);
    fVar3 = cosf(rotation * 0.017453292);
    fVar13 = dest.width - fVar11;
    fVar15 = dest.height - fVar14;
    fVar16 = fVar2 * fVar13 + fStack_b0;
    fStack_b0 = fVar2 * -fVar11 + fStack_b0;
    fVar13 = fVar3 * fVar13 + fStack_b4;
    fStack_ac = fVar3 * -fVar11 + fStack_b4;
    fStack_74 = fVar2 * -fVar15 + fVar13;
    local_78 = fVar3 * fVar15 + fVar16;
    fStack_70 = fVar2 * fVar14 + fVar13;
    fStack_6c = fVar3 * -fVar14 + fVar16;
    local_b8 = fVar3 * fVar15 + fStack_b0;
    fStack_b4 = fVar2 * -fVar15 + fStack_ac;
    fStack_b0 = fVar3 * -fVar14 + fStack_b0;
    fStack_ac = fVar2 * fVar14 + fStack_ac;
  }
  else {
    fStack_b4 = fStack_b4 - fVar11;
    fStack_b0 = fStack_b0 - fVar14;
    fStack_74 = dest.width + fStack_b4;
    local_b8 = dest.height + fStack_b0;
    local_78 = local_b8;
    fStack_70 = fStack_74;
    fStack_6c = fStack_b0;
    fStack_ac = fStack_b4;
  }
  rlCheckRenderBatchLimit(4);
  rlSetTexture(texture.id);
  rlBegin(7);
  rlColor4ub(tint.r,tint.g,tint.b,tint.a);
  rlNormal3f(0.0,0.0,1.0);
  if (0.0 <= fVar5) {
    fVar5 = fVar6 / fVar12;
    fVar6 = fVar17 + fVar6;
    auVar10._4_4_ = fVar18;
    auVar10._0_4_ = fVar7 + fVar18;
    auVar10._8_4_ = in_XMM1_Dc + in_XMM0_Dc;
    auVar10._12_4_ = in_XMM1_Dd + in_XMM0_Dd;
    auVar9._4_4_ = fVar4;
    auVar9._0_4_ = fVar4;
    auVar9._8_4_ = fVar4;
    auVar9._12_4_ = fVar4;
    auVar9 = divps(auVar10,auVar9);
    rlTexCoord2f(fVar5,auVar9._4_4_);
    rlVertex2f(fStack_ac,fStack_b0);
    local_c8._0_4_ = auVar9._0_4_;
    rlTexCoord2f(fVar5,(float)local_c8);
    rlVertex2f(fStack_b4,local_b8);
    local_c8 = auVar9._0_8_;
  }
  else {
    fVar5 = (fVar17 + fVar6) / fVar12;
    auVar8._4_4_ = fVar18;
    auVar8._0_4_ = fVar7 + fVar18;
    auVar8._8_4_ = in_XMM1_Dc + in_XMM0_Dc;
    auVar8._12_4_ = in_XMM1_Dd + in_XMM0_Dd;
    auVar1._4_4_ = fVar4;
    auVar1._0_4_ = fVar4;
    auVar1._8_4_ = fVar4;
    auVar1._12_4_ = fVar4;
    auVar9 = divps(auVar8,auVar1);
    rlTexCoord2f(fVar5,auVar9._4_4_);
    rlVertex2f(fStack_ac,fStack_b0);
    local_c8._0_4_ = auVar9._0_4_;
    rlTexCoord2f(fVar5,(float)local_c8);
    rlVertex2f(fStack_b4,local_b8);
    local_c8 = auVar9._0_8_;
  }
  rlTexCoord2f(fVar6 / fVar12,(float)local_c8);
  rlVertex2f(fStack_74,local_78);
  rlTexCoord2f(fVar6 / fVar12,local_c8._4_4_);
  rlVertex2f(fStack_70,fStack_6c);
  rlEnd();
  rlSetTexture(0);
  return;
}

Assistant:

void DrawTexturePro(Texture2D texture, Rectangle source, Rectangle dest, Vector2 origin, float rotation, Color tint)
{
    // Check if texture is valid
    if (texture.id > 0)
    {
        float width = (float)texture.width;
        float height = (float)texture.height;

        bool flipX = false;

        if (source.width < 0) { flipX = true; source.width *= -1; }
        if (source.height < 0) source.y -= source.height;

        Vector2 topLeft = { 0 };
        Vector2 topRight = { 0 };
        Vector2 bottomLeft = { 0 };
        Vector2 bottomRight = { 0 };

        // Only calculate rotation if needed
        if (rotation == 0.0f)
        {
            float x = dest.x - origin.x;
            float y = dest.y - origin.y;
            topLeft = (Vector2){ x, y };
            topRight = (Vector2){ x + dest.width, y };
            bottomLeft = (Vector2){ x, y + dest.height };
            bottomRight = (Vector2){ x + dest.width, y + dest.height };
        }
        else
        {
            float sinRotation = sinf(rotation*DEG2RAD);
            float cosRotation = cosf(rotation*DEG2RAD);
            float x = dest.x;
            float y = dest.y;
            float dx = -origin.x;
            float dy = -origin.y;

            topLeft.x = x + dx*cosRotation - dy*sinRotation;
            topLeft.y = y + dx*sinRotation + dy*cosRotation;

            topRight.x = x + (dx + dest.width)*cosRotation - dy*sinRotation;
            topRight.y = y + (dx + dest.width)*sinRotation + dy*cosRotation;

            bottomLeft.x = x + dx*cosRotation - (dy + dest.height)*sinRotation;
            bottomLeft.y = y + dx*sinRotation + (dy + dest.height)*cosRotation;

            bottomRight.x = x + (dx + dest.width)*cosRotation - (dy + dest.height)*sinRotation;
            bottomRight.y = y + (dx + dest.width)*sinRotation + (dy + dest.height)*cosRotation;
        }

        rlCheckRenderBatchLimit(4);     // Make sure there is enough free space on the batch buffer

        rlSetTexture(texture.id);
        rlBegin(RL_QUADS);

            rlColor4ub(tint.r, tint.g, tint.b, tint.a);
            rlNormal3f(0.0f, 0.0f, 1.0f);                          // Normal vector pointing towards viewer

            // Top-left corner for texture and quad
            if (flipX) rlTexCoord2f((source.x + source.width)/width, source.y/height);
            else rlTexCoord2f(source.x/width, source.y/height);
            rlVertex2f(topLeft.x, topLeft.y);

            // Bottom-left corner for texture and quad
            if (flipX) rlTexCoord2f((source.x + source.width)/width, (source.y + source.height)/height);
            else rlTexCoord2f(source.x/width, (source.y + source.height)/height);
            rlVertex2f(bottomLeft.x, bottomLeft.y);

            // Bottom-right corner for texture and quad
            if (flipX) rlTexCoord2f(source.x/width, (source.y + source.height)/height);
            else rlTexCoord2f((source.x + source.width)/width, (source.y + source.height)/height);
            rlVertex2f(bottomRight.x, bottomRight.y);

            // Top-right corner for texture and quad
            if (flipX) rlTexCoord2f(source.x/width, source.y/height);
            else rlTexCoord2f((source.x + source.width)/width, source.y/height);
            rlVertex2f(topRight.x, topRight.y);

        rlEnd();
        rlSetTexture(0);

        // NOTE: Vertex position can be transformed using matrices
        // but the process is way more costly than just calculating
        // the vertex positions manually, like done above.
        // I leave here the old implementation for educational pourposes,
        // just in case someone wants to do some performance test
        /*
        rlSetTexture(texture.id);
        rlPushMatrix();
            rlTranslatef(dest.x, dest.y, 0.0f);
            if (rotation != 0.0f) rlRotatef(rotation, 0.0f, 0.0f, 1.0f);
            rlTranslatef(-origin.x, -origin.y, 0.0f);

            rlBegin(RL_QUADS);
                rlColor4ub(tint.r, tint.g, tint.b, tint.a);
                rlNormal3f(0.0f, 0.0f, 1.0f);                          // Normal vector pointing towards viewer

                // Bottom-left corner for texture and quad
                if (flipX) rlTexCoord2f((source.x + source.width)/width, source.y/height);
                else rlTexCoord2f(source.x/width, source.y/height);
                rlVertex2f(0.0f, 0.0f);

                // Bottom-right corner for texture and quad
                if (flipX) rlTexCoord2f((source.x + source.width)/width, (source.y + source.height)/height);
                else rlTexCoord2f(source.x/width, (source.y + source.height)/height);
                rlVertex2f(0.0f, dest.height);

                // Top-right corner for texture and quad
                if (flipX) rlTexCoord2f(source.x/width, (source.y + source.height)/height);
                else rlTexCoord2f((source.x + source.width)/width, (source.y + source.height)/height);
                rlVertex2f(dest.width, dest.height);

                // Top-left corner for texture and quad
                if (flipX) rlTexCoord2f(source.x/width, source.y/height);
                else rlTexCoord2f((source.x + source.width)/width, source.y/height);
                rlVertex2f(dest.width, 0.0f);
            rlEnd();
        rlPopMatrix();
        rlSetTexture(0);
        */
    }
}